

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O0

void mult_verify::MultVerifyUintUint64(void)

{
  bool bVar1;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  uint32_t ret;
  TestCase<unsigned_int,_unsigned_long,_0> test;
  TestVector<unsigned_int,_unsigned_long,_0> tests;
  unsigned_long in_stack_ffffffffffffff28;
  allocator *in_stack_ffffffffffffff30;
  TestVector<unsigned_int,_unsigned_long,_0> *in_stack_ffffffffffffff40;
  byte local_a8;
  allocator local_99;
  string local_98 [36];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_74;
  byte local_6d;
  allocator<char> local_59;
  string local_58 [7];
  undefined1 in_stack_ffffffffffffffaf;
  unsigned_long in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  uint local_30 [4];
  byte local_20;
  TestVector<unsigned_int,_unsigned_long,_0> local_18;
  
  TestVector<unsigned_int,_unsigned_long,_0>::TestVector(&local_18);
  TestVector<unsigned_int,_unsigned_long,_0>::GetNext(in_stack_ffffffffffffff40);
  while( true ) {
    bVar1 = TestVector<unsigned_int,_unsigned_long,_0>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeMultiply<unsigned_int,unsigned_long>
                      ((uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),in_stack_ffffffffffffff28,
                       (uint *)0x1ade7d);
    if (bVar1 != (bool)(local_20 & 1)) {
      in_stack_ffffffffffffff40 = (TestVector<unsigned_int,_unsigned_long,_0> *)&local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_58,"Error in case uint32_uint64: ",(allocator *)in_stack_ffffffffffffff40);
      err_msg<unsigned_int,unsigned_long>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                 (bool)in_stack_ffffffffffffffaf);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    local_6d = 1;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_74,local_30);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator*=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if ((local_6d & 1) != (local_20 & 1)) {
      in_stack_ffffffffffffff30 = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,"Error in case uint32_uint64 throw: ",in_stack_ffffffffffffff30);
      err_msg<unsigned_int,unsigned_long>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                 (bool)in_stack_ffffffffffffffaf);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    TestVector<unsigned_int,_unsigned_long,_0>::GetNext(in_stack_ffffffffffffff40);
    local_20 = local_a8;
  }
  return;
}

Assistant:

void MultVerifyUintUint64()
{
	TestVector< std::uint32_t, std::uint64_t, OpType::Mult > tests;
	TestCase<std::uint32_t, std::uint64_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::uint32_t ret;
		if( SafeMultiply(test.x, test.y, ret) != test.fExpected )
		{
			//assert(false);
			err_msg( "Error in case uint32_uint64: ", test.x, test.y, test.fExpected );
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::uint32_t> si(test.x);
			si *= test.y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != test.fExpected )
		{
			err_msg( "Error in case uint32_uint64 throw: ", test.x, test.y, test.fExpected );
		}

		test = tests.GetNext();
	}
}